

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_331718d::Impl::registerHandler
          (Impl *this,TypeInfo *typeinfo,GenericResponseSentHandler *handler)

{
  pair<std::__detail::_Node_iterator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_false,_false>,_bool>
  pVar1;
  unique_lock<std::mutex> lock;
  TypeInfo *local_58;
  long *local_50 [2];
  long local_40 [2];
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &(this->handlers).responseSentMutex;
  local_30._M_owns = false;
  local_58 = typeinfo;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  pVar1 = std::
          _Hashtable<dap::TypeInfo_const*,std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>,std::allocator<std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>>,std::__detail::_Select1st,std::equal_to<dap::TypeInfo_const*>,std::hash<dap::TypeInfo_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<dap::TypeInfo_const*&,std::function<void(void_const*,dap::Error_const*)>const&>
                    ((_Hashtable<dap::TypeInfo_const*,std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>,std::allocator<std::pair<dap::TypeInfo_const*const,std::function<void(void_const*,dap::Error_const*)>>>,std::__detail::_Select1st,std::equal_to<dap::TypeInfo_const*>,std::hash<dap::TypeInfo_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&(this->handlers).responseSentMap,&local_58,handler);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (*local_58->_vptr_TypeInfo[2])(local_50);
    EventHandlers::errorfLocked
              (&this->handlers,"Response sent handler for \'%s\' already registered",local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void registerHandler(const dap::TypeInfo* typeinfo,
                       const GenericResponseSentHandler& handler) override {
    handlers.put(typeinfo, handler);
  }